

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Headers.cpp
# Opt level: O0

void __thiscall KDReports::Test::testSingleHeader(Test *this)

{
  bool bVar1;
  byte bVar2;
  pointer pRVar3;
  Header *pHVar4;
  int iVar5;
  HeaderMap *headers;
  QFlags<KDReports::HeaderLocation> local_34;
  Header *local_30;
  Header *theHeader;
  Report report;
  unique_ptr<KDReports::ReportPrivate,_std::default_delete<KDReports::ReportPrivate>_> uStack_18;
  Test *local_10;
  Test *this_local;
  
  local_10 = this;
  KDReports::Report::Report((Report *)&theHeader,(QObject *)0x0);
  QFlags<KDReports::HeaderLocation>::QFlags(&local_34,AllPages);
  local_30 = (Header *)KDReports::Report::header((QFlags *)&theHeader);
  pRVar3 = std::unique_ptr<KDReports::ReportPrivate,_std::default_delete<KDReports::ReportPrivate>_>
           ::operator->(&uStack_18);
  bVar1 = QMap<QFlags<KDReports::HeaderLocation>,_KDReports::Header_*>::isEmpty
                    ((QMap<QFlags<KDReports::HeaderLocation>,_KDReports::Header_*> *)(pRVar3 + 0x78)
                    );
  bVar2 = QTest::qVerify((bool)(~bVar1 & 1),"!headers.isEmpty()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                         ,0x29);
  if ((bVar2 & 1) != 0) {
    iVar5 = (int)(pRVar3 + 0x78);
    pHVar4 = (Header *)KDReports::HeaderMap::headerForPage(iVar5,1);
    bVar1 = QTest::qCompare<KDReports::Header>
                      (pHVar4,local_30,"headers.headerForPage(1, 2)","&theHeader",
                       "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                       ,0x2a);
    if (bVar1) {
      pHVar4 = (Header *)KDReports::HeaderMap::headerForPage(iVar5,2);
      QTest::qCompare<KDReports::Header>
                (pHVar4,local_30,"headers.headerForPage(2, 2)","&theHeader",
                 "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                 ,0x2b);
    }
  }
  KDReports::Report::~Report((Report *)&theHeader);
  return;
}

Assistant:

void testSingleHeader()
    {
        Report report;
        Header &theHeader = report.header();
        HeaderMap &headers = report.d->m_headers;
        QVERIFY(!headers.isEmpty());
        QCOMPARE(headers.headerForPage(1, 2), &theHeader);
        QCOMPARE(headers.headerForPage(2, 2), &theHeader);
    }